

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  CURLcode CVar5;
  char *pcVar6;
  ulong ulnum;
  size_t sVar7;
  char hexstr [3];
  char *ptr;
  byte local_4b;
  byte local_4a;
  undefined1 local_49;
  char **local_48;
  size_t *local_40;
  char *local_38;
  
  local_40 = olen;
  if (length == 0) {
    length = strlen(string);
  }
  pcVar6 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar6 == (char *)0x0) {
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar7 = 0;
    sVar1 = length + 1;
    local_48 = ostring;
    bVar2 = local_4b;
    bVar3 = local_4a;
    for (; length != 0; length = length - 1) {
      bVar4 = *string;
      local_4b = bVar2;
      local_4a = bVar3;
      if ((length < 3) || (bVar4 != 0x25)) {
LAB_00595675:
        if ((ctrl == REJECT_CTRL && bVar4 < 0x20) ||
           (bVar2 = local_4b, bVar3 = local_4a, ctrl == REJECT_ZERO && bVar4 == 0)) {
          (*Curl_cfree)(pcVar6);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        local_4b = ((byte *)string)[1];
        if ((byte)(local_4b - 0x30) < 10) {
LAB_00595619:
          local_4a = ((byte *)string)[2];
          if (9 < (byte)(local_4a - 0x30)) {
            bVar4 = 0x25;
            if ((0x25 < local_4a - 0x41) ||
               ((0x3f0000003fU >> ((ulong)(local_4a - 0x41) & 0x3f) & 1) == 0)) goto LAB_00595696;
          }
          string = (char *)((byte *)string + 2);
          local_49 = 0;
          ulnum = strtoul((char *)&local_4b,&local_38,0x10);
          bVar4 = curlx_ultouc(ulnum);
          length = sVar1 - 3;
          goto LAB_00595675;
        }
        bVar4 = 0x25;
        if ((local_4b - 0x41 < 0x26) &&
           ((0x3f0000003fU >> ((ulong)(local_4b - 0x41) & 0x3f) & 1) != 0)) goto LAB_00595619;
      }
LAB_00595696:
      local_4a = bVar3;
      local_4b = bVar2;
      pcVar6[sVar7] = bVar4;
      sVar7 = sVar7 + 1;
      string = (char *)((byte *)string + 1);
      sVar1 = length;
      bVar2 = local_4b;
      bVar3 = local_4a;
    }
    pcVar6[sVar7] = '\0';
    if (local_40 != (size_t *)0x0) {
      *local_40 = sVar7;
    }
    *local_48 = pcVar6;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;
  size_t strindex = 0;
  unsigned long hex;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string)) + 1;
  ns = malloc(alloc);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      string += 2;
      alloc -= 2;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}